

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_parse(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int local_64;
  size_t use_len;
  mbedtls_x509_crt *local_50;
  mbedtls_pem_context pem;
  
  iVar2 = -0x2800;
  if (buf != (uchar *)0x0 && chain != (mbedtls_x509_crt *)0x0) {
    if (((buflen == 0) || (buf[buflen - 1] != '\0')) ||
       (pcVar4 = strstr((char *)buf,"-----BEGIN CERTIFICATE-----"), pcVar4 == (char *)0x0)) {
      iVar2 = mbedtls_x509_crt_parse_der(chain,buf,buflen);
      return iVar2;
    }
    bVar1 = false;
    local_64 = 0;
    iVar2 = 0;
    local_50 = chain;
    for (; 1 < buflen; buflen = buflen - sVar5) {
      mbedtls_pem_init(&pem);
      iVar3 = mbedtls_pem_read_buffer
                        (&pem,"-----BEGIN CERTIFICATE-----","-----END CERTIFICATE-----",buf,
                         (uchar *)0x0,0,&use_len);
      sVar5 = use_len;
      if (iVar3 == 0) {
        iVar3 = mbedtls_x509_crt_parse_der(local_50,pem.buf,pem.buflen);
        mbedtls_pem_free(&pem);
        if (iVar3 != 0) {
          if (iVar3 == -0x2880) {
            return -0x2880;
          }
          goto LAB_0010dec6;
        }
        bVar1 = true;
      }
      else {
        if (iVar3 == -0x1480) {
          return -0x1480;
        }
        if (iVar3 == -0x1080) break;
        mbedtls_pem_free(&pem);
        sVar5 = use_len;
LAB_0010dec6:
        if (local_64 == 0) {
          local_64 = iVar3;
        }
        iVar2 = iVar2 + 1;
      }
      buf = buf + sVar5;
    }
    if ((!bVar1) && (iVar2 = -0x2780, local_64 != 0)) {
      iVar2 = local_64;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_parse( mbedtls_x509_crt *chain, const unsigned char *buf, size_t buflen )
{
#if defined(MBEDTLS_PEM_PARSE_C)
    int success = 0, first_error = 0, total_failed = 0;
    int buf_format = MBEDTLS_X509_FORMAT_DER;
#endif

    /*
     * Check for valid input
     */
    if( chain == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    /*
     * Determine buffer content. Buffer contains either one DER certificate or
     * one or more PEM certificates.
     */
#if defined(MBEDTLS_PEM_PARSE_C)
    if( buflen != 0 && buf[buflen - 1] == '\0' &&
        strstr( (const char *) buf, "-----BEGIN CERTIFICATE-----" ) != NULL )
    {
        buf_format = MBEDTLS_X509_FORMAT_PEM;
    }

    if( buf_format == MBEDTLS_X509_FORMAT_DER )
        return mbedtls_x509_crt_parse_der( chain, buf, buflen );
#else
    return mbedtls_x509_crt_parse_der( chain, buf, buflen );
#endif

#if defined(MBEDTLS_PEM_PARSE_C)
    if( buf_format == MBEDTLS_X509_FORMAT_PEM )
    {
        int ret;
        mbedtls_pem_context pem;

        /* 1 rather than 0 since the terminating NULL byte is counted in */
        while( buflen > 1 )
        {
            size_t use_len;
            mbedtls_pem_init( &pem );

            /* If we get there, we know the string is null-terminated */
            ret = mbedtls_pem_read_buffer( &pem,
                           "-----BEGIN CERTIFICATE-----",
                           "-----END CERTIFICATE-----",
                           buf, NULL, 0, &use_len );

            if( ret == 0 )
            {
                /*
                 * Was PEM encoded
                 */
                buflen -= use_len;
                buf += use_len;
            }
            else if( ret == MBEDTLS_ERR_PEM_BAD_INPUT_DATA )
            {
                return( ret );
            }
            else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
            {
                mbedtls_pem_free( &pem );

                /*
                 * PEM header and footer were found
                 */
                buflen -= use_len;
                buf += use_len;

                if( first_error == 0 )
                    first_error = ret;

                total_failed++;
                continue;
            }
            else
                break;

            ret = mbedtls_x509_crt_parse_der( chain, pem.buf, pem.buflen );

            mbedtls_pem_free( &pem );

            if( ret != 0 )
            {
                /*
                 * Quit parsing on a memory error
                 */
                if( ret == MBEDTLS_ERR_X509_ALLOC_FAILED )
                    return( ret );

                if( first_error == 0 )
                    first_error = ret;

                total_failed++;
                continue;
            }

            success = 1;
        }
    }

    if( success )
        return( total_failed );
    else if( first_error )
        return( first_error );
    else
        return( MBEDTLS_ERR_X509_CERT_UNKNOWN_FORMAT );
#endif /* MBEDTLS_PEM_PARSE_C */
}